

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

void __thiscall OpenMD::Snapshot::wrapVector(Snapshot *this,Vector3d *pos)

{
  int i;
  long lVar1;
  double dVar2;
  double dVar3;
  Vector3d scaled;
  Vector<double,_3U> local_48;
  Vector<double,_3U> local_30;
  
  if ((this->frameData).usePBC == true) {
    if ((this->frameData).orthoRhombic == true) {
      for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
        dVar2 = *(double *)((long)(pos->super_Vector<double,_3U>).data_ + lVar1) *
                *(double *)
                 ((long)(this->frameData).invHmat.super_SquareMatrix<double,_3>.
                        super_RectMatrix<double,_3U,_3U>.data_[0] + lVar1 * 4);
        if (0.0 <= dVar2) {
          dVar3 = floor(dVar2 + 0.5);
        }
        else {
          dVar3 = ceil(dVar2 + -0.5);
        }
        *(double *)((long)(pos->super_Vector<double,_3U>).data_ + lVar1) =
             (dVar2 - dVar3) *
             *(double *)
              ((long)(this->frameData).hmat.super_SquareMatrix<double,_3>.
                     super_RectMatrix<double,_3U,_3U>.data_[0] + lVar1 * 4);
      }
    }
    else {
      operator*(&local_30,(RectMatrix<double,_3U,_3U> *)&(this->frameData).invHmat,
                &pos->super_Vector<double,_3U>);
      Vector<double,_3U>::Vector(&local_48,&local_30);
      for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
        dVar2 = local_48.data_[lVar1];
        if (0.0 <= dVar2) {
          dVar3 = floor(dVar2 + 0.5);
        }
        else {
          dVar3 = ceil(dVar2 + -0.5);
        }
        local_48.data_[lVar1] = dVar2 - dVar3;
      }
      operator*(&local_30,(RectMatrix<double,_3U,_3U> *)&(this->frameData).hmat,&local_48);
      Vector3<double>::operator=(pos,&local_30);
    }
  }
  return;
}

Assistant:

void Snapshot::wrapVector(Vector3d& pos) {
    if (!frameData.usePBC) return;

    if (!frameData.orthoRhombic) {
      Vector3d scaled = frameData.invHmat * pos;
      for (int i = 0; i < 3; i++) {
        scaled[i] -= roundMe(scaled[i]);
      }
      // calc the wrapped real coordinates from the wrapped scaled coordinates
      pos = frameData.hmat * scaled;
    } else {
      RealType scaled;
      for (int i = 0; i < 3; i++) {
        scaled = pos[i] * frameData.invHmat(i, i);
        scaled -= roundMe(scaled);
        pos[i] = scaled * frameData.hmat(i, i);
      }
    }
  }